

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::Impl::copy_compute_pipeline
          (Impl *this,VkComputePipelineCreateInfo *create_info,ScratchAllocator *alloc,
          VkPipeline *base_pipelines,uint32_t base_pipeline_count,VkDevice device,
          PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
          VkComputePipelineCreateInfo **out_create_info)

{
  __node_base *p_Var1;
  uint uVar2;
  VkSpecializationInfo *info;
  char *__s;
  bool bVar3;
  VkBaseInStructure *base_in;
  Impl *__dest;
  Impl *pIVar4;
  size_t sVar5;
  void *__dest_00;
  Impl *this_00;
  ptrdiff_t _Num;
  size_t size;
  long *in_FS_OFFSET;
  
  this_00 = (Impl *)alloc;
  __dest = (Impl *)ScratchAllocator::allocate_raw(alloc,0x60,0x10);
  if (__dest != (Impl *)0x0) {
    this_00 = __dest;
    memmove(__dest,create_info,0x60);
  }
  uVar2 = *(uint *)&(__dest->ycbcr_temp_allocator).impl;
  *(uint *)&(__dest->ycbcr_temp_allocator).impl = uVar2 & 0x7ffffc3f;
  pIVar4 = (__dest->temp_allocator).impl;
  do {
    if (pIVar4 == (Impl *)0x0) {
      p_Var1 = &(__dest->descriptor_sets)._M_h._M_before_begin;
      if ((uVar2 & 4) == 0) {
LAB_0012fa11:
        (__dest->descriptor_sets)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      }
      else if (p_Var1->_M_nxt == (_Hash_node_base *)0x0) {
        uVar2 = (uint)(__dest->descriptor_sets)._M_h._M_element_count;
        if (-1 < (long)(int)uVar2) {
          if (base_pipeline_count <= uVar2) {
            if (2 < *(int *)(*in_FS_OFFSET + -0x18)) {
              return false;
            }
            bVar3 = Internal::log_thread_callback
                              (LOG_ERROR,"Base pipeline index is out of range.\n");
            if (!bVar3) {
              copy_compute_pipeline();
              return false;
            }
            return false;
          }
          p_Var1->_M_nxt = (_Hash_node_base *)base_pipelines[(int)uVar2];
        }
      }
      *(undefined4 *)&(__dest->descriptor_sets)._M_h._M_element_count = 0xffffffff;
      info = (VkSpecializationInfo *)(__dest->descriptor_sets)._M_h._M_buckets;
      if (info != (VkSpecializationInfo *)0x0) {
        copy_specialization_info
                  (this_00,info,alloc,(VkSpecializationInfo **)&__dest->descriptor_sets);
      }
      __s = *(char **)&__dest->should_record_identifier_only;
      sVar5 = strlen(__s);
      size = sVar5 + 1;
      if ((size == 0) ||
         (__dest_00 = ScratchAllocator::allocate_raw(alloc,size,0x10), __dest_00 == (void *)0x0)) {
        __dest_00 = (void *)0x0;
      }
      else {
        memmove(__dest_00,__s,size);
      }
      *(void **)&__dest->should_record_identifier_only = __dest_00;
      bVar3 = copy_pnext_chain(this,__dest->module_identifier_database_iface,alloc,
                               &__dest->module_identifier_database_iface,(DynamicStateInfo *)0x0,0);
      if (!bVar3) {
        return false;
      }
      bVar3 = add_module_identifier
                        ((VkPipelineShaderStageCreateInfo *)&__dest->database_iface,alloc,device,
                         gsmcii);
      if (!bVar3) {
        return false;
      }
      bVar3 = copy_pnext_chain(this,(__dest->temp_allocator).impl,alloc,
                               &(__dest->temp_allocator).impl,(DynamicStateInfo *)0x0,0);
      if (bVar3) {
        *out_create_info = (VkComputePipelineCreateInfo *)__dest;
        return true;
      }
      return false;
    }
    if (*(int *)&(pIVar4->blocks).
                 super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
                 ._M_impl.super__Vector_impl_data._M_start == 0x3ba1f5f5) {
      *(undefined4 *)&(__dest->ycbcr_temp_allocator).impl = 0;
      goto LAB_0012fa11;
    }
    pIVar4 = (Impl *)(pIVar4->blocks).
                     super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

bool StateRecorder::Impl::copy_compute_pipeline(const VkComputePipelineCreateInfo *create_info, ScratchAllocator &alloc,
                                                const VkPipeline *base_pipelines, uint32_t base_pipeline_count,
                                                VkDevice device, PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
                                                VkComputePipelineCreateInfo **out_create_info)
{
	auto *info = copy(create_info, 1, alloc);
	info->flags = normalize_pipeline_creation_flags(info->flags);
	if (find_pnext<VkPipelineCreateFlags2CreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR, info->pNext))
		info->flags = 0;

	if (!update_derived_pipeline(info, base_pipelines, base_pipeline_count))
		return false;

	if (info->stage.pSpecializationInfo)
		if (!copy_specialization_info(info->stage.pSpecializationInfo, alloc, &info->stage.pSpecializationInfo))
			return false;

	info->stage.pName = copy(info->stage.pName, strlen(info->stage.pName) + 1, alloc);

	if (!copy_pnext_chain(info->stage.pNext, alloc, &info->stage.pNext, nullptr, 0))
		return false;

	if (!add_module_identifier(&info->stage, alloc, device, gsmcii))
		return false;

	if (!copy_pnext_chain(info->pNext, alloc, &info->pNext, nullptr, 0))
		return false;

	*out_create_info = info;
	return true;
}